

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_debugger_manager.cpp
# Opt level: O2

shared_ptr<Debugger> __thiscall
EmmyDebuggerManager::AddDebugger(EmmyDebuggerManager *this,lua_State *L)

{
  lua_Hook *__mutex;
  int iVar1;
  iterator iVar2;
  lua_State *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  EmmyDebuggerManager *this_00;
  shared_ptr<Debugger> sVar3;
  lua_State *mainState;
  pair<const_unsigned_long_long,_std::shared_ptr<Debugger>_> local_58;
  UniqueIdentifyType identify;
  lua_State *local_38;
  
  __mutex = &L->hook;
  this_00 = (EmmyDebuggerManager *)__mutex;
  std::mutex::lock((mutex *)__mutex);
  identify = GetUniqueIdentify(this_00,in_RDX);
  (this->stateBreak).super___shared_ptr<HookStateBreak,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->stateBreak).super___shared_ptr<HookStateBreak,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  iVar2 = std::
          _Rb_tree<unsigned_long_long,_std::pair<const_unsigned_long_long,_std::shared_ptr<Debugger>_>,_std::_Select1st<std::pair<const_unsigned_long_long,_std::shared_ptr<Debugger>_>_>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::shared_ptr<Debugger>_>_>_>
          ::find((_Rb_tree<unsigned_long_long,_std::pair<const_unsigned_long_long,_std::shared_ptr<Debugger>_>,_std::_Select1st<std::pair<const_unsigned_long_long,_std::shared_ptr<Debugger>_>_>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::shared_ptr<Debugger>_>_>_>
                  *)(L + 1),&identify);
  if (iVar2._M_node == (_Base_ptr)&L[1].tt) {
    local_38 = L;
    if (luaVersion == LUA_JIT) {
      mainState = (lua_State *)0x0;
      iVar1 = (*lua_pushthread)(in_RDX);
      (*lua_settop)(in_RDX,-2);
      if (iVar1 == 1) {
        mainState = in_RDX;
      }
      std::make_shared<Debugger,lua_State*&,EmmyDebuggerManager*>
                ((lua_State **)&local_58,(EmmyDebuggerManager **)&mainState);
    }
    else {
      mainState = (lua_State *)identify;
      std::make_shared<Debugger,lua_State*,EmmyDebuggerManager*>
                ((lua_State **)&local_58,(EmmyDebuggerManager **)&mainState);
    }
    std::__shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2> *)&local_58);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_58.second);
    local_58.first = identify;
    std::__shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_58.second.super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2> *)this);
    std::
    _Rb_tree<unsigned_long_long,std::pair<unsigned_long_long_const,std::shared_ptr<Debugger>>,std::_Select1st<std::pair<unsigned_long_long_const,std::shared_ptr<Debugger>>>,std::less<unsigned_long_long>,std::allocator<std::pair<unsigned_long_long_const,std::shared_ptr<Debugger>>>>
    ::_M_insert_unique<std::pair<unsigned_long_long_const,std::shared_ptr<Debugger>>>
              ((_Rb_tree<unsigned_long_long,std::pair<unsigned_long_long_const,std::shared_ptr<Debugger>>,std::_Select1st<std::pair<unsigned_long_long_const,std::shared_ptr<Debugger>>>,std::less<unsigned_long_long>,std::allocator<std::pair<unsigned_long_long_const,std::shared_ptr<Debugger>>>>
                *)(L + 1),&local_58);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_58.second.super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
  }
  else {
    std::__shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2> *)&iVar2._M_node[1]._M_parent);
  }
  Debugger::SetCurrentState
            ((Debugger *)
             (this->stateBreak).super___shared_ptr<HookStateBreak,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,in_RDX);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  sVar3.super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar3.super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Debugger>)sVar3.super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Debugger> EmmyDebuggerManager::AddDebugger(lua_State* L)
{
	std::lock_guard<std::mutex> lock(debuggerMtx);

	auto identify = GetUniqueIdentify(L);

	std::shared_ptr<Debugger> debugger = nullptr;

	auto it = debuggers.find(identify);

	if (it == debuggers.end())
	{
		if (luaVersion != LuaVersion::LUA_JIT)
		{
			debugger = std::make_shared<Debugger>(reinterpret_cast<lua_State*>(identify), this);
		}
		else
		{
			// 如果首次add 的state不是main state，则main state视为空指针
			// 但不影响luajit附加调试和远程调试
			lua_State* mainState = nullptr;

			int ret = lua_pushthread(L);
			lua_pop(L, 1);
			if (ret == 1)
			{
				mainState = L;
			}

			debugger = std::make_shared<Debugger>(mainState, this);
		}
		debuggers.insert({identify, debugger});
	}
	else
	{
		debugger = it->second;
	}

	debugger->SetCurrentState(L);
	return debugger;
}